

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

Reader * __thiscall xLearn::Solver::create_reader(Solver *this)

{
  Reader *pRVar1;
  ObjectCreatorRegistry_xLearn_reader_registry *this_00;
  ostream *poVar2;
  long in_RDI;
  string str;
  Reader *reader;
  allocator *this_01;
  string *in_stack_ffffffffffffff00;
  char *local_d0;
  allocator local_b9;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_90 [4];
  LogSeverity in_stack_ffffffffffffff74;
  Logger local_70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Reader *local_10;
  
  if ((*(byte *)(in_RDI + 0x1ec) & 1) == 0) {
    local_d0 = "dmatrix";
  }
  else {
    local_d0 = "memory";
    if ((*(byte *)(in_RDI + 1) & 1) != 0) {
      local_d0 = "disk";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,local_d0,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GetRegistry_xLearn_reader_registry();
  this_00 = (ObjectCreatorRegistry_xLearn_reader_registry *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(char *)this_00,&local_69);
  local_10 = ObjectCreatorRegistry_xLearn_reader_registry::CreateObject
                       (this_00,in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (local_10 == (Reader *)0x0) {
    Logger::Logger(&local_70,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,(allocator *)&stack0xffffffffffffff6f);
    this_01 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"create_reader",this_01);
    poVar2 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    poVar2 = std::operator<<(poVar2,"Cannot create reader: ");
    std::operator<<(poVar2,local_30);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    Logger::~Logger((Logger *)this_01);
  }
  pRVar1 = local_10;
  std::__cxx11::string::~string(local_30);
  return pRVar1;
}

Assistant:

Reader* Solver::create_reader() {
  Reader* reader;
  std::string str = hyper_param_.from_file ? hyper_param_.on_disk ? "disk" : "memory" : "dmatrix";
  reader = CREATE_READER(str.c_str());
  if (reader == nullptr) {
    LOG(FATAL) << "Cannot create reader: " << str;
  }
  return reader;
}